

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGlitch.c
# Opt level: O2

void Gli_ManSwitchesAndGlitches(Gli_Man_t *p,int nPatterns,float PiTransProb,int fVerbose)

{
  abctime aVar1;
  abctime aVar2;
  int iVar3;
  int iBit;
  int iVar4;
  bool bVar5;
  
  aVar1 = Abc_Clock();
  Gia_ManRandom(1);
  Gli_ManFinalize(p);
  if (p->nRegs == 0) {
    iVar3 = 0;
    if (0 < nPatterns) {
      iVar3 = nPatterns;
    }
    while (bVar5 = iVar3 != 0, iVar3 = iVar3 + -1, bVar5) {
      Gli_ManSetPiRandom(p,PiTransProb);
      Gli_ManSwitching(p);
      Gli_ManGlitching(p);
    }
  }
  else {
    iVar3 = ((nPatterns >> 5) + 1) - (uint)((nPatterns & 0x1fU) == 0);
    Gli_ManSimulateSeqPref(p,0x10);
    iBit = 0;
    if (iVar3 < 1) {
      iVar3 = iBit;
    }
    for (; iBit != 0x20; iBit = iBit + 1) {
      Gli_ManSetDataSaved(p,iBit);
      iVar4 = iVar3;
      while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
        Gli_ManSetPiRandomSeq(p,PiTransProb);
        Gli_ManSwitching(p);
        Gli_ManGlitching(p);
      }
    }
  }
  if (fVerbose != 0) {
    iVar3 = 0x7b5b74;
    printf("\nSimulated %d patterns.  ",nPatterns);
    Abc_Print(iVar3,"%s =","Memory");
    Abc_Print(iVar3,"%10.3f MB  ",(double)(p->nObjData << 2) * 9.5367431640625e-07);
    Abc_Print(iVar3,"%s =","Time");
    aVar2 = Abc_Clock();
    Abc_Print(iVar3,"%9.2f sec\n",(double)(aVar2 - aVar1) / 1000000.0);
    return;
  }
  return;
}

Assistant:

void Gli_ManSwitchesAndGlitches( Gli_Man_t * p, int nPatterns, float PiTransProb, int fVerbose )
{
    int i, k;
    abctime clk = Abc_Clock();
    Gia_ManRandom( 1 );
    Gli_ManFinalize( p );
    if ( p->nRegs == 0 )
    {
        for ( i = 0; i < nPatterns; i++ )
        {
            Gli_ManSetPiRandom( p, PiTransProb );
            Gli_ManSwitching( p );
            Gli_ManGlitching( p );
//            Gli_ManVerify( p );
        }
    }
    else 
    {
        int nIters = Abc_BitWordNum(nPatterns);
        Gli_ManSimulateSeqPref( p, 16 );
        for ( i = 0; i < 32; i++ )
        {
            Gli_ManSetDataSaved( p, i );
            for ( k = 0; k < nIters; k++ )
            {
                Gli_ManSetPiRandomSeq( p, PiTransProb );
                Gli_ManSwitching( p );
                Gli_ManGlitching( p );
//                Gli_ManVerify( p );
            }
        }
    }
    if ( fVerbose )
    {
        printf( "\nSimulated %d patterns.  ", nPatterns );
        ABC_PRMn( "Memory", 4*p->nObjData );
        ABC_PRT( "Time", Abc_Clock() - clk );
    }
}